

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbuffer.cpp
# Opt level: O2

void __thiscall QBuffer::setBuffer(QBuffer *this,QByteArray *byteArray)

{
  QObjectData *this_00;
  QObjectData *pQVar1;
  bool bVar2;
  long in_FS_OFFSET;
  QMessageLogger local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QIODevice).super_QObject.d_ptr.d;
  bVar2 = QIODevice::isOpen(&this->super_QIODevice);
  if (bVar2) {
    local_38.context.version = 2;
    local_38.context.function._4_4_ = 0;
    local_38.context._4_8_ = 0;
    local_38.context._12_8_ = 0;
    local_38.context.category = "default";
    QMessageLogger::warning(&local_38,"QBuffer::setBuffer: Buffer is open");
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return;
    }
  }
  else {
    this_00 = pQVar1 + 5;
    if (byteArray == (QByteArray *)0x0) {
      byteArray = (QByteArray *)this_00;
    }
    pQVar1[4].bindingStorage.bindingStatus = (QBindingStatus *)byteArray;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      QByteArray::clear((QByteArray *)this_00);
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QBuffer::setBuffer(QByteArray *byteArray)
{
    Q_D(QBuffer);
    if (isOpen()) {
        qWarning("QBuffer::setBuffer: Buffer is open");
        return;
    }
    if (byteArray) {
        d->buf = byteArray;
    } else {
        d->buf = &d->defaultBuf;
    }
    d->defaultBuf.clear();
}